

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O0

void write_relocs(void)

{
  reloc_entry_t reloc;
  block_header_t header;
  
  if (relocs_count != 0) {
    write_block_header((block_header_t *)0x1093fe);
    for (cur = root; cur != (reloc_t *)0x0; cur = cur->next) {
      write_reloc_entry((reloc_entry_t *)0x109454);
    }
  }
  return;
}

Assistant:

void write_relocs()
{
    block_header_t header;
    reloc_entry_t reloc;
    if (relocs_count == 0)
        return;
    
    header.type = relocations;
    header.num_entries = relocs_count;
    write_block_header(&header);
    
    cur = root;
    while (cur)
    {
        reloc.sym_id = cur->sym_id;
        reloc.section_id = cur->section_id;
        reloc.offset = cur->offset;
        reloc.flags = cur->flags;
        write_reloc_entry(&reloc);
        cur = cur->next;
    }
}